

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteObjectLibStatement
          (cmNinjaNormalTargetGenerator *this,string *config)

{
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *this_00;
  cmGlobalNinjaGenerator *pcVar1;
  mapped_type *pmVar2;
  cmGeneratedFileStream *os;
  cmNinjaBuild build;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  string local_160;
  cmNinjaBuild local_140;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"phony",(allocator<char> *)&local_1a0);
  cmNinjaBuild::cmNinjaBuild(&local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_180,&this->super_cmNinjaTargetGenerator);
  std::operator+(&local_1a0,"Object library ",&local_180);
  std::__cxx11::string::operator=((string *)&local_140,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  cmLocalNinjaGenerator::AppendTargetOutputs
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &local_140.Outputs,config);
  target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  this_00 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar1 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](&pcVar1->Configs,config);
  cmLocalNinjaGenerator::AppendTargetOutputs
            (this_00,target,&pmVar2->ByproductsForCleanTarget,config);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&local_1a0,&this->super_cmNinjaTargetGenerator,config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&local_140.ExplicitDeps,&local_1a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a0);
  pcVar1 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(pcVar1,(ostream *)os,&local_140,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild(&local_140);
  pcVar1 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            (&local_140.Comment,&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias
            (pcVar1,&local_140.Comment,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  std::__cxx11::string::~string((string *)&local_140);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteObjectLibStatement(
  const std::string& config)
{
  // Write a phony output that depends on all object files.
  {
    cmNinjaBuild build("phony");
    build.Comment = "Object library " + this->GetTargetName();
    this->GetLocalGenerator()->AppendTargetOutputs(this->GetGeneratorTarget(),
                                                   build.Outputs, config);
    this->GetLocalGenerator()->AppendTargetOutputs(
      this->GetGeneratorTarget(),
      this->GetGlobalGenerator()->GetByproductsForCleanTarget(config), config);
    build.ExplicitDeps = this->GetObjects(config);
    this->GetGlobalGenerator()->WriteBuild(this->GetCommonFileStream(), build);
  }

  // Add aliases for the target name.
  this->GetGlobalGenerator()->AddTargetAlias(
    this->GetTargetName(), this->GetGeneratorTarget(), config);
}